

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_base.c
# Opt level: O0

int lj_cf_getfenv(lua_State *L)

{
  uint uVar1;
  TValue *pTVar2;
  lua_State *in_RDI;
  int level;
  cTValue *o;
  GCfunc *fn;
  ErrMsg in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  anon_union_4_2_de2f9c34_for_anon_struct_8_2_fd66bcdd_for_TValue_2_0 aVar3;
  lua_State *in_stack_ffffffffffffff90;
  undefined8 in_stack_ffffffffffffff98;
  lua_State *in_stack_ffffffffffffffa0;
  int32_t local_54;
  cTValue *local_50;
  lua_State *local_40;
  
  local_50 = in_RDI->base;
  local_40 = in_RDI;
  if ((in_RDI->top <= local_50) || ((local_50->field_2).it != 0xfffffff7)) {
    local_54 = lj_lib_optint(in_stack_ffffffffffffffa0,
                             (int)((ulong)in_stack_ffffffffffffff98 >> 0x20),
                             (int32_t)in_stack_ffffffffffffff98);
    local_50 = lj_debug_frame(local_40,local_54,&local_54);
    if (local_50 == (cTValue *)0x0) {
      lj_err_arg(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88);
    }
  }
  uVar1 = (local_50->u32).lo;
  pTVar2 = local_40->top;
  local_40->top = pTVar2 + 1;
  if (*(char *)((ulong)uVar1 + 6) == '\0') {
    aVar3 = *(anon_union_4_2_de2f9c34_for_anon_struct_8_2_fd66bcdd_for_TValue_2_0 *)
             ((ulong)uVar1 + 8);
  }
  else {
    aVar3 = (anon_union_4_2_de2f9c34_for_anon_struct_8_2_fd66bcdd_for_TValue_2_0)
            (local_40->env).gcptr32;
  }
  (pTVar2->field_2).field_0 = aVar3;
  (pTVar2->field_2).it = 0xfffffff4;
  return 1;
}

Assistant:

LJLIB_CF(getfenv)
{
  GCfunc *fn;
  cTValue *o = L->base;
  if (!(o < L->top && tvisfunc(o))) {
    int level = lj_lib_optint(L, 1, 1);
    o = lj_debug_frame(L, level, &level);
    if (o == NULL)
      lj_err_arg(L, 1, LJ_ERR_INVLVL);
  }
  fn = &gcval(o)->fn;
  settabV(L, L->top++, isluafunc(fn) ? tabref(fn->l.env) : tabref(L->env));
  return 1;
}